

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MergeSimilarFunctions.cpp
# Opt level: O1

Expression * __thiscall
wasm::ParamInfo::lowerToExpression(ParamInfo *this,Builder *builder,Module *module,size_t index)

{
  __index_type _Var1;
  long lVar2;
  size_t sVar3;
  char *pcVar4;
  HeapType heapType;
  Const *this_00;
  Function *pFVar5;
  Literal *other;
  Name name;
  Literal local_40;
  
  _Var1 = *(__index_type *)
           ((long)&(this->values).
                   super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                   .super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                   super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                   super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                   super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                   super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_> + 0x38);
  if (_Var1 == '\x01') {
    lVar2 = *(long *)&(this->values).
                      super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                      .super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                      super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                      super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                      super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                      super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>;
    sVar3 = *(size_t *)(lVar2 + index * 0x10);
    pcVar4 = *(char **)(lVar2 + 8 + index * 0x10);
    name.super_IString.str._M_str = pcVar4;
    name.super_IString.str._M_len = sVar3;
    pFVar5 = Module::getFunction(module,name);
    heapType.id = (pFVar5->type).id;
    this_00 = (Const *)MixedArena::allocSpace(&builder->wasm->allocator,0x20,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id = RefFuncId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id = 0;
    (this_00->value).field_0.i64 = 0;
    (this_00->value).field_0.i64 = sVar3;
    (this_00->value).field_0.func.super_IString.str._M_str = pcVar4;
    RefFunc::finalize((RefFunc *)this_00,heapType);
  }
  else {
    if (_Var1 != '\0') {
      handle_unreachable("unexpected const value type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MergeSimilarFunctions.cpp"
                         ,0x8a);
    }
    other = (Literal *)
            (*(long *)((long)&(this->values).
                              super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                              .super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                              super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                              super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                              super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                              super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_>
                      + 0x20) + -0x18 + index * 0x18);
    if (index == 0) {
      other = (Literal *)
              ((long)&(this->values).
                      super__Variant_base<wasm::Literals,_std::vector<wasm::Name,_std::allocator<wasm::Name>_>_>
                      .super__Move_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                      super__Copy_assign_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                      super__Move_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                      super__Copy_ctor_alias<wasm::Literals,_std::vector<wasm::Name>_>.
                      super__Variant_storage_alias<wasm::Literals,_std::vector<wasm::Name>_> + 8);
    }
    Literal::Literal(&local_40,other);
    this_00 = Builder::makeConst(builder,&local_40);
    Literal::~Literal(&local_40);
  }
  return (Expression *)this_00;
}

Assistant:

Expression*
  lowerToExpression(Builder& builder, Module* module, size_t index) const {
    if (const auto literals = std::get_if<Literals>(&values)) {
      return builder.makeConst((*literals)[index]);
    } else if (auto callees = std::get_if<std::vector<Name>>(&values)) {
      auto fnName = (*callees)[index];
      auto heapType = module->getFunction(fnName)->type;
      return builder.makeRefFunc(fnName, heapType);
    } else {
      WASM_UNREACHABLE("unexpected const value type");
    }
  }